

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count.cpp
# Opt level: O0

void __thiscall Count::~Count(Count *this)

{
  Count *in_RDI;
  
  ~Count(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

Count::~Count()
{
}